

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx512.cpp
# Opt level: O2

int ncnn::binary_op_7_13_19_29<ncnn::BinaryOp_x86_avx512_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  void *pvVar4;
  undefined1 auVar5 [32];
  ulong uVar6;
  float *pfVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  
  uVar1 = a->c;
  iVar8 = a->h * a->w * a->d * a->elempack;
  Mat::create_like(c,a,opt->blob_allocator);
  iVar11 = -100;
  if ((c->data != (void *)0x0) && ((long)c->c * c->cstep != 0)) {
    uVar16 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar16 = 0;
    }
    for (uVar6 = 0; uVar6 != uVar16; uVar6 = uVar6 + 1) {
      pvVar2 = a->data;
      pvVar3 = b->data;
      pvVar4 = c->data;
      lVar14 = a->elemsize * a->cstep * uVar6;
      lVar13 = b->elemsize * b->cstep * uVar6;
      lVar12 = c->elemsize * c->cstep * uVar6;
      lVar15 = 0;
      for (iVar11 = 0; iVar11 + 0xf < iVar8; iVar11 = iVar11 + 0x10) {
        auVar17 = vmulps_avx512f(*(undefined1 (*) [64])((long)pvVar3 + lVar15 + lVar13),
                                 *(undefined1 (*) [64])((long)pvVar2 + lVar15 + lVar14));
        *(undefined1 (*) [64])((long)pvVar4 + lVar15 + lVar12) = auVar17;
        lVar15 = lVar15 + 0x40;
      }
      for (; iVar11 + 7 < iVar8; iVar11 = iVar11 + 8) {
        pfVar7 = (float *)((long)pvVar3 + lVar15 + lVar13);
        pfVar9 = (float *)((long)pvVar2 + lVar15 + lVar14);
        auVar5._4_4_ = pfVar7[1] * pfVar9[1];
        auVar5._0_4_ = *pfVar7 * *pfVar9;
        auVar5._8_4_ = pfVar7[2] * pfVar9[2];
        auVar5._12_4_ = pfVar7[3] * pfVar9[3];
        auVar5._16_4_ = pfVar7[4] * pfVar9[4];
        auVar5._20_4_ = pfVar7[5] * pfVar9[5];
        auVar5._24_4_ = pfVar7[6] * pfVar9[6];
        auVar5._28_4_ = pfVar7[7];
        *(undefined1 (*) [32])((long)pvVar4 + lVar15 + lVar12) = auVar5;
        lVar15 = lVar15 + 0x20;
      }
      for (; iVar11 + 3 < iVar8; iVar11 = iVar11 + 4) {
        pfVar7 = (float *)((long)pvVar3 + lVar15 + lVar13);
        pfVar9 = (float *)((long)pvVar2 + lVar15 + lVar14);
        auVar18._0_4_ = *pfVar7 * *pfVar9;
        auVar18._4_4_ = pfVar7[1] * pfVar9[1];
        auVar18._8_4_ = pfVar7[2] * pfVar9[2];
        auVar18._12_4_ = pfVar7[3] * pfVar9[3];
        *(undefined1 (*) [16])((long)pvVar4 + lVar15 + lVar12) = auVar18;
        lVar15 = lVar15 + 0x10;
      }
      pfVar7 = (float *)((long)pvVar2 + lVar14 + lVar15);
      pfVar9 = (float *)((long)pvVar3 + lVar13 + lVar15);
      pfVar10 = (float *)((long)pvVar4 + lVar12 + lVar15);
      for (; iVar11 < iVar8; iVar11 = iVar11 + 1) {
        *pfVar10 = *pfVar9 * *pfVar7;
        pfVar7 = pfVar7 + 1;
        pfVar9 = pfVar9 + 1;
        pfVar10 = pfVar10 + 1;
      }
    }
    iVar11 = 0;
  }
  return iVar11;
}

Assistant:

static int binary_op_7_13_19_29(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 7 13 19 29
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float* ptr1 = b.channel(q);
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _p1 = _mm512_loadu_ps(ptr1);
            __m512 _outp = op.func_pack16(_p, _p1);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _p1 = _mm256_loadu_ps(ptr1);
            __m256 _outp = op.func_pack8(_p, _p1);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _p1 = _mm_load_ps(ptr1);
            __m128 _outp = op.func_pack4(_p, _p1);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, *ptr1);
            ptr += 1;
            ptr1 += 1;
            outptr += 1;
        }
    }

    return 0;
}